

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

void layout_to_channel_map(cubeb_channel_layout layout,pa_channel_map *cm)

{
  byte bVar1;
  cubeb_channel channel_00;
  pa_channel_position_t pVar2;
  uint uVar3;
  pa_channel_map *in_RSI;
  cubeb_channel_layout in_EDI;
  uint channels_from_layout;
  uint32_t channel;
  uint32_t i;
  cubeb_channel_layout channelMap;
  uint32_t channels;
  uint local_18;
  uint local_14;
  
  if ((in_RSI == (pa_channel_map *)0x0) || (in_EDI == 0)) {
    __assert_fail("cm && layout != CUBEB_LAYOUT_UNDEFINED",
                  "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_pulse.c"
                  ,0x245,"void layout_to_channel_map(cubeb_channel_layout, pa_channel_map *)");
  }
  (*cubeb_pa_channel_map_init)(in_RSI);
  local_14 = 0;
  bVar1 = 0;
  for (local_18 = in_EDI; local_18 != 0; local_18 = local_18 >> 1) {
    channel_00 = (local_18 & 1) << (bVar1 & 0x1f);
    if (channel_00 != CHANNEL_UNKNOWN) {
      pVar2 = cubeb_channel_to_pa_channel(channel_00);
      in_RSI->map[local_14] = pVar2;
      local_14 = local_14 + 1;
    }
    bVar1 = bVar1 + 1;
  }
  uVar3 = cubeb_channel_layout_nb_channels(in_EDI);
  if (uVar3 < 0x100) {
    in_RSI->channels = (uint8_t)uVar3;
    if ((in_RSI->channels == '\x01') && (in_RSI->map[0] == PA_CHANNEL_POSITION_CENTER)) {
      in_RSI->map[0] = PA_CHANNEL_POSITION_MONO;
    }
    return;
  }
  __assert_fail("channels_from_layout <= UINT8_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_pulse.c"
                ,0x254,"void layout_to_channel_map(cubeb_channel_layout, pa_channel_map *)");
}

Assistant:

static void
layout_to_channel_map(cubeb_channel_layout layout, pa_channel_map * cm)
{
  assert(cm && layout != CUBEB_LAYOUT_UNDEFINED);

  WRAP(pa_channel_map_init)(cm);

  uint32_t channels = 0;
  cubeb_channel_layout channelMap = layout;
  for (uint32_t i = 0; channelMap != 0; ++i) {
    uint32_t channel = (channelMap & 1) << i;
    if (channel != 0) {
      cm->map[channels] = cubeb_channel_to_pa_channel(channel);
      channels++;
    }
    channelMap = channelMap >> 1;
  }
  unsigned int channels_from_layout = cubeb_channel_layout_nb_channels(layout);
  assert(channels_from_layout <= UINT8_MAX);
  cm->channels = (uint8_t)channels_from_layout;

  // Special case single channel center mapping as mono.
  if (cm->channels == 1 && cm->map[0] == PA_CHANNEL_POSITION_FRONT_CENTER) {
    cm->map[0] = PA_CHANNEL_POSITION_MONO;
  }
}